

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

void __thiscall
density::
sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
::
reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
          (sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
           *this,int *i_construction_params)

{
  reentrant_put_transaction<Func> local_38;
  int *local_18;
  int *i_construction_params_local;
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  local_18 = i_construction_params;
  i_construction_params_local = (int *)this;
  start_reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            (&local_38,this,i_construction_params);
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::commit(&local_38);
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_38);
  return;
}

Assistant:

void reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)
              .commit();
        }